

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSProperty * add_property(JSContext *ctx,JSObject *p,JSAtom prop,int prop_flags)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSShape *pJVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  JSRuntime *in_RSI;
  void *in_RDI;
  JSProperty *new_prop;
  JSShape *new_sh;
  JSShape *sh;
  JSShape *in_stack_ffffffffffffffc8;
  _func_size_t_void_ptr *p_Var4;
  JSContext *in_stack_fffffffffffffff8;
  JSProperty *pJVar5;
  
  p_Var4 = (in_RSI->mf).js_malloc_usable_size;
  if (p_Var4[0x18] != (_func_size_t_void_ptr)0x0) {
    pJVar2 = (JSRuntime *)
             find_hashed_shape_prop
                       (in_RSI,(JSShape *)CONCAT44(in_EDX,in_ECX),(JSAtom)((ulong)p_Var4 >> 0x20),
                        (int)p_Var4);
    if (pJVar2 != (JSRuntime *)0x0) {
      if (*(int *)((long)&(pJVar2->malloc_state).malloc_count + 4) != *(int *)(p_Var4 + 0x24)) {
        in_stack_ffffffffffffffc8 =
             (JSShape *)js_realloc(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
        if (in_stack_ffffffffffffffc8 == (JSShape *)0x0) {
          return (JSProperty *)0x0;
        }
        (in_RSI->malloc_state).malloc_count = (size_t)in_stack_ffffffffffffffc8;
      }
      pJVar3 = js_dup_shape((JSShape *)pJVar2);
      (in_RSI->mf).js_malloc_usable_size = (_func_size_t_void_ptr *)pJVar3;
      js_free_shape(pJVar2,in_stack_ffffffffffffffc8);
      return (JSProperty *)
             ((in_RSI->malloc_state).malloc_count +
             (long)((int)(pJVar2->malloc_state).malloc_size + -1) * 0x10);
    }
    if (*(int *)p_Var4 != 1) {
      pJVar2 = (JSRuntime *)js_clone_shape((JSContext *)CONCAT44(prop,prop_flags),sh);
      if (pJVar2 == (JSRuntime *)0x0) {
        return (JSProperty *)0x0;
      }
      *(undefined1 *)&(pJVar2->mf).js_malloc_usable_size = 1;
      js_shape_hash_link(pJVar2,in_stack_ffffffffffffffc8);
      js_free_shape(pJVar2,in_stack_ffffffffffffffc8);
      (in_RSI->mf).js_malloc_usable_size = (_func_size_t_void_ptr *)pJVar2;
    }
  }
  iVar1 = add_shape_property((JSContext *)CONCAT44(prop,prop_flags),(JSShape **)sh,
                             (JSObject *)new_sh,new_prop._4_4_,(int)new_prop);
  if (iVar1 == 0) {
    pJVar5 = (JSProperty *)
             ((in_RSI->malloc_state).malloc_count +
             (long)(*(int *)((in_RSI->mf).js_malloc_usable_size + 0x28) + -1) * 0x10);
  }
  else {
    pJVar5 = (JSProperty *)0x0;
  }
  return pJVar5;
}

Assistant:

static JSProperty *add_property(JSContext *ctx,
                                JSObject *p, JSAtom prop, int prop_flags)
{
    JSShape *sh, *new_sh;

    sh = p->shape;
    if (sh->is_hashed) {
        /* try to find an existing shape */
        new_sh = find_hashed_shape_prop(ctx->rt, sh, prop, prop_flags);
        if (new_sh) {
            /* matching shape found: use it */
            /*  the property array may need to be resized */
            if (new_sh->prop_size != sh->prop_size) {
                JSProperty *new_prop;
                new_prop = js_realloc(ctx, p->prop, sizeof(p->prop[0]) *
                                      new_sh->prop_size);
                if (!new_prop)
                    return NULL;
                p->prop = new_prop;
            }
            p->shape = js_dup_shape(new_sh);
            js_free_shape(ctx->rt, sh);
            return &p->prop[new_sh->prop_count - 1];
        } else if (sh->header.ref_count != 1) {
            /* if the shape is shared, clone it */
            new_sh = js_clone_shape(ctx, sh);
            if (!new_sh)
                return NULL;
            /* hash the cloned shape */
            new_sh->is_hashed = TRUE;
            js_shape_hash_link(ctx->rt, new_sh);
            js_free_shape(ctx->rt, p->shape);
            p->shape = new_sh;
        }
    }
    assert(p->shape->header.ref_count == 1);
    if (add_shape_property(ctx, &p->shape, p, prop, prop_flags))
        return NULL;
    return &p->prop[p->shape->prop_count - 1];
}